

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockReturnValueTest.cpp
# Opt level: O0

void __thiscall
TEST_MockReturnValueTest_LongIntegerReturnValueSetsDifferentValuesWhileParametersAreIgnored_Test::
testBody(TEST_MockReturnValueTest_LongIntegerReturnValueSetsDifferentValuesWhileParametersAreIgnored_Test
         *this)

{
  undefined8 uVar1;
  int iVar2;
  MockSupport *pMVar3;
  undefined4 extraout_var;
  MockExpectedCall *pMVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  UtestShell *pUVar5;
  undefined4 extraout_var_03;
  MockActualCall *pMVar6;
  long lVar7;
  TestTerminator *pTVar8;
  undefined4 extraout_var_04;
  long lVar9;
  SimpleString local_250;
  MockNamedValue local_240;
  SimpleString local_1f0;
  SimpleString local_1e0;
  SimpleString local_1d0;
  MockNamedValue local_1c0;
  SimpleString local_170;
  MockNamedValue local_160;
  SimpleString local_110;
  SimpleString local_100;
  SimpleString local_f0;
  MockNamedValue local_e0;
  SimpleString local_90;
  SimpleString local_80;
  SimpleString local_70;
  SimpleString local_60;
  SimpleString local_50 [2];
  SimpleString local_30;
  undefined8 local_20;
  long another_ret_value;
  long ret_value;
  TEST_MockReturnValueTest_LongIntegerReturnValueSetsDifferentValuesWhileParametersAreIgnored_Test
  *this_local;
  
  another_ret_value = 1;
  local_20 = 2;
  ret_value = (long)this;
  SimpleString::SimpleString(&local_30,"");
  pMVar3 = mock(&local_30,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(local_50,"foo");
  iVar2 = (*pMVar3->_vptr_MockSupport[3])(pMVar3,local_50);
  SimpleString::SimpleString(&local_60,"p1");
  pMVar4 = MockExpectedCall::withParameter
                     ((MockExpectedCall *)CONCAT44(extraout_var,iVar2),&local_60,1);
  iVar2 = (*pMVar4->_vptr_MockExpectedCall[9])();
  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0xd8))
            ((long *)CONCAT44(extraout_var_00,iVar2),another_ret_value);
  SimpleString::~SimpleString(&local_60);
  SimpleString::~SimpleString(local_50);
  SimpleString::~SimpleString(&local_30);
  SimpleString::SimpleString(&local_70,"");
  pMVar3 = mock(&local_70,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_80,"foo");
  iVar2 = (*pMVar3->_vptr_MockSupport[3])(pMVar3,&local_80);
  SimpleString::SimpleString(&local_90,"p1");
  pMVar4 = MockExpectedCall::withParameter
                     ((MockExpectedCall *)CONCAT44(extraout_var_01,iVar2),&local_90,1);
  iVar2 = (*pMVar4->_vptr_MockExpectedCall[9])();
  (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar2) + 0xd8))
            ((long *)CONCAT44(extraout_var_02,iVar2),local_20);
  SimpleString::~SimpleString(&local_90);
  SimpleString::~SimpleString(&local_80);
  SimpleString::~SimpleString(&local_70);
  pUVar5 = UtestShell::getCurrent();
  lVar9 = another_ret_value;
  SimpleString::SimpleString(&local_f0,"");
  pMVar3 = mock(&local_f0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_100,"foo");
  iVar2 = (*pMVar3->_vptr_MockSupport[6])(pMVar3,&local_100);
  SimpleString::SimpleString(&local_110,"p1");
  pMVar6 = MockActualCall::withParameter
                     ((MockActualCall *)CONCAT44(extraout_var_03,iVar2),&local_110,1);
  (*pMVar6->_vptr_MockActualCall[0x15])(&local_e0);
  lVar7 = MockNamedValue::getLongIntValue(&local_e0);
  pTVar8 = UtestShell::getCurrentTestTerminator();
  (*pUVar5->_vptr_UtestShell[0xe])
            (pUVar5,lVar9,lVar7,
             "LONGS_EQUAL(ret_value, mock().actualCall(\"foo\").withParameter(\"p1\", 1).returnValue().getLongIntValue()) failed"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0x1db,pTVar8);
  MockNamedValue::~MockNamedValue(&local_e0);
  SimpleString::~SimpleString(&local_110);
  SimpleString::~SimpleString(&local_100);
  SimpleString::~SimpleString(&local_f0);
  pUVar5 = UtestShell::getCurrent();
  lVar9 = another_ret_value;
  SimpleString::SimpleString(&local_170,"");
  pMVar3 = mock(&local_170,(MockFailureReporter *)0x0);
  (*pMVar3->_vptr_MockSupport[8])(&local_160);
  lVar7 = MockNamedValue::getLongIntValue(&local_160);
  pTVar8 = UtestShell::getCurrentTestTerminator();
  (*pUVar5->_vptr_UtestShell[0xe])
            (pUVar5,lVar9,lVar7,
             "LONGS_EQUAL(ret_value, mock().returnValue().getLongIntValue()) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0x1dc,pTVar8);
  MockNamedValue::~MockNamedValue(&local_160);
  SimpleString::~SimpleString(&local_170);
  pUVar5 = UtestShell::getCurrent();
  uVar1 = local_20;
  SimpleString::SimpleString(&local_1d0,"");
  pMVar3 = mock(&local_1d0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_1e0,"foo");
  iVar2 = (*pMVar3->_vptr_MockSupport[6])(pMVar3,&local_1e0);
  SimpleString::SimpleString(&local_1f0,"p1");
  pMVar6 = MockActualCall::withParameter
                     ((MockActualCall *)CONCAT44(extraout_var_04,iVar2),&local_1f0,1);
  (*pMVar6->_vptr_MockActualCall[0x15])(&local_1c0);
  lVar9 = MockNamedValue::getLongIntValue(&local_1c0);
  pTVar8 = UtestShell::getCurrentTestTerminator();
  (*pUVar5->_vptr_UtestShell[0xe])
            (pUVar5,uVar1,lVar9,
             "LONGS_EQUAL(another_ret_value, mock().actualCall(\"foo\").withParameter(\"p1\", 1).returnValue().getLongIntValue()) failed"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0x1dd,pTVar8);
  MockNamedValue::~MockNamedValue(&local_1c0);
  SimpleString::~SimpleString(&local_1f0);
  SimpleString::~SimpleString(&local_1e0);
  SimpleString::~SimpleString(&local_1d0);
  pUVar5 = UtestShell::getCurrent();
  uVar1 = local_20;
  SimpleString::SimpleString(&local_250,"");
  pMVar3 = mock(&local_250,(MockFailureReporter *)0x0);
  (*pMVar3->_vptr_MockSupport[8])(&local_240);
  lVar9 = MockNamedValue::getLongIntValue(&local_240);
  pTVar8 = UtestShell::getCurrentTestTerminator();
  (*pUVar5->_vptr_UtestShell[0xe])
            (pUVar5,uVar1,lVar9,
             "LONGS_EQUAL(another_ret_value, mock().returnValue().getLongIntValue()) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0x1de,pTVar8);
  MockNamedValue::~MockNamedValue(&local_240);
  SimpleString::~SimpleString(&local_250);
  return;
}

Assistant:

TEST(MockReturnValueTest, LongIntegerReturnValueSetsDifferentValuesWhileParametersAreIgnored)
{
    long int ret_value = 1;
    long int another_ret_value = 2;

    mock().expectOneCall("foo").withParameter("p1", 1).ignoreOtherParameters().andReturnValue(ret_value);
    mock().expectOneCall("foo").withParameter("p1", 1).ignoreOtherParameters().andReturnValue(another_ret_value);

    LONGS_EQUAL(ret_value, mock().actualCall("foo").withParameter("p1", 1).returnValue().getLongIntValue());
    LONGS_EQUAL(ret_value, mock().returnValue().getLongIntValue());
    LONGS_EQUAL(another_ret_value, mock().actualCall("foo").withParameter("p1", 1).returnValue().getLongIntValue());
    LONGS_EQUAL(another_ret_value, mock().returnValue().getLongIntValue());
}